

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall
cfd::core::ByteData160::ByteData160
          (ByteData160 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vector)

{
  size_type sVar1;
  CfdException *this_00;
  allocator local_71;
  string local_70;
  size_type local_50;
  CfdSourceLocation local_48;
  allocator<unsigned_char> local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_local;
  ByteData160 *this_local;
  
  local_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)vector;
  vector_local = &this->data_;
  ::std::allocator<unsigned_char>::allocator(&local_19);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,0x14,&local_19);
  ::std::allocator<unsigned_char>::~allocator(&local_19);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
  if (sVar1 != 0x14) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0xba;
    local_48.funcname = "ByteData160";
    local_50 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    logger::warn<unsigned_long>(&local_48,"ByteData160 size unmatch. size={}.",&local_50);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"ByteData160 size unmatch.",&local_71);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_70);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18);
  return;
}

Assistant:

ByteData160::ByteData160(const std::vector<uint8_t>& vector)
    : data_(std::vector<uint8_t>(kByteData160Length)) {
  if (vector.size() != kByteData160Length) {
    warn(CFD_LOG_SOURCE, "ByteData160 size unmatch. size={}.", vector.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ByteData160 size unmatch.");
  }
  data_ = vector;
}